

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_newthread(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  long idx;
  HSQUIRRELVM dest;
  HSQUIRRELVM in_RDI;
  SQInteger unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  HSQUIRRELVM newv;
  SQInteger stksize;
  SQObjectPtr *func;
  SQInteger in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  idx = ((pSVar1->super_SQObject)._unVal.pClosure)->_function->_stacksize * 2 + 2;
  if (idx < 0x11) {
    idx = 0x11;
  }
  dest = sq_newthread(in_stack_00000008,unaff_retaddr);
  sq_move(dest,in_RDI,idx);
  return 1;
}

Assistant:

static SQInteger base_newthread(HSQUIRRELVM v)
{
    SQObjectPtr &func = stack_get(v,2);
    SQInteger stksize = (_closure(func)->_function->_stacksize << 1) +2;
    HSQUIRRELVM newv = sq_newthread(v, (stksize < MIN_STACK_OVERHEAD + 2)? MIN_STACK_OVERHEAD + 2 : stksize);
    sq_move(newv,v,-2);
    return 1;
}